

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::getEnormousString
          (TestMoreStuffImpl *this,GetEnormousStringContext context)

{
  long *in_RDX;
  Own<kj::_::ImmediatePromiseNode<kj::_::Void>_> OVar1;
  Promise<void> PVar2;
  PointerBuilder local_88;
  Builder local_70;
  StructBuilder local_58;
  undefined1 local_30;
  
  local_30 = 0;
  (**(code **)(*in_RDX + 0x10))(&local_70);
  local_88.pointer = (WirePointer *)local_70.content.size_;
  local_88.segment = (SegmentBuilder *)local_70._0_8_;
  local_88.capTable = (CapTableBuilder *)local_70.content.ptr;
  PointerBuilder::getStruct(&local_58,&local_88,(StructSize)0x10000,(word *)0x0);
  local_88.segment = local_58.segment;
  local_88.capTable = local_58.capTable;
  local_88.pointer = local_58.pointers;
  PointerBuilder::initBlob<capnp::Text>(&local_70,&local_88,100000000);
  OVar1 = kj::heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_58);
  PVar2.super_PromiseBase.node.ptr = OVar1.ptr;
  *(SegmentBuilder **)&this->super_Server = local_58.segment;
  *(CapTableBuilder **)&(this->super_Server).field_0x8 = local_58.capTable;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::getEnormousString(GetEnormousStringContext context) {
  context.getResults().initStr(100000000);  // 100MB
  return kj::READY_NOW;
}